

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

float overlap(float x1,float w1,float x2,float w2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = x1 - w1 * 0.5;
  fVar2 = x2 - w2 * 0.5;
  if (fVar3 <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = x1 + w1 * 0.5;
  fVar1 = w2 * 0.5 + x2;
  if (fVar1 <= fVar2) {
    fVar2 = fVar1;
  }
  return fVar2 - fVar3;
}

Assistant:

static float overlap(float x1, float w1, float x2, float w2)
{
    float l1 = x1 - w1/2;
    float l2 = x2 - w2/2;
    float left = l1 > l2 ? l1 : l2;
    float r1 = x1 + w1/2;
    float r2 = x2 + w2/2;
    float right = r1 < r2 ? r1 : r2;
    return right - left;
}